

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8d_vdpu1.c
# Opt level: O0

MPP_RET hal_vp8d_vdpu1_gen_regs(void *hal,HalTaskInfo *task)

{
  long lVar1;
  DXVA_PicParams_VP8 *p;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *__s;
  RK_U8 *probTbl;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  DXVA_PicParams_VP8 *pic_param;
  VP8DRegSet_t_conflict *regs;
  VP8DHalContext_t *ctx;
  RK_U8 *probe_ptr;
  RK_U8 *segmap_ptr;
  MppBuffer framebuf;
  uint local_20;
  RK_U32 mb_height;
  RK_U32 mb_width;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  mb_height = 0;
  local_20 = 0;
  framebuf._4_4_ = 0;
  segmap_ptr = (RK_U8 *)0x0;
  lVar1 = *(long *)((long)hal + 0x18);
  p = (DXVA_PicParams_VP8 *)(task->dec).syntax.data;
  _mb_width = task;
  task_local = (HalTaskInfo *)hal;
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"enter\n",0x1ca,
               "hal_vp8d_vdpu1_gen_regs");
  }
  hal_vp8_init_hwcfg((VP8DHalContext_t *)hal);
  uVar2 = p->width + 0xf;
  local_20 = uVar2 >> 4;
  uVar3 = p->height + 0xf;
  framebuf._4_4_ = uVar3 >> 4;
  *(uint *)(lVar1 + 0x10) = *(uint *)(lVar1 + 0x10) & 0x7fffff | local_20 << 0x17;
  *(uint *)(lVar1 + 0x10) = *(uint *)(lVar1 + 0x10) & 0xfff807ff | (framebuf._4_4_ & 0xff) << 0xb;
  *(uint *)(lVar1 + 0x10) = *(uint *)(lVar1 + 0x10) & 0xffffffc7 | (uVar2 >> 0xd & 7) << 3;
  *(uint *)(lVar1 + 0x10) = *(uint *)(lVar1 + 0x10) & 0xfffffff8 | uVar3 >> 0xc & 7;
  if ((((p->field_4).wFrameTagFlags & 1) == 0) &&
     (__s = mpp_buffer_get_ptr_with_caller
                      (*(MppBuffer *)((long)hal + 0x38),"hal_vp8d_vdpu1_gen_regs"),
     __s != (void *)0x0)) {
    memset(__s,0,0xc00);
  }
  probTbl = (RK_U8 *)mpp_buffer_get_ptr_with_caller
                               (*(MppBuffer *)((long)hal + 0x30),"hal_vp8d_vdpu1_gen_regs");
  if (probTbl != (RK_U8 *)0x0) {
    hal_vp8hw_asic_probe_update(p,probTbl);
  }
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 8),(uint)((p->CurrPic).field_0.bPicEntry & 0x7f),
             SLOT_BUFFER,&segmap_ptr);
  iVar4 = mpp_buffer_get_fd_with_caller(segmap_ptr,"hal_vp8d_vdpu1_gen_regs");
  *(int *)(lVar1 + 0x34) = iVar4;
  if (((p->field_4).wFrameTagFlags & 1) == 0) {
    if (0x400000 < local_20 * framebuf._4_4_ * 0x100) {
      _mpp_log_l(4,"hal_vp8d_vdpu1","mb_width*mb_height is big then 0x400000,iommu err",(char *)0x0)
      ;
    }
    *(undefined4 *)(lVar1 + 0x38) = *(undefined4 *)(lVar1 + 0x34);
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0xe,local_20 * framebuf._4_4_ * 0x100);
  }
  else if (((p->lst_fb_idx).field_0.bPicEntry & 0x7f) < 0x7f) {
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 8),(uint)((p->lst_fb_idx).field_0.bPicEntry & 0x7f),
               SLOT_BUFFER,&segmap_ptr);
    iVar4 = mpp_buffer_get_fd_with_caller(segmap_ptr,"hal_vp8d_vdpu1_gen_regs");
    *(int *)(lVar1 + 0x38) = iVar4;
  }
  else {
    *(undefined4 *)(lVar1 + 0x38) = *(undefined4 *)(lVar1 + 0x34);
  }
  if (((p->gld_fb_idx).field_0.bPicEntry & 0x7f) < 0x7f) {
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 8),(uint)((p->gld_fb_idx).field_0.bPicEntry & 0x7f),
               SLOT_BUFFER,&segmap_ptr);
    iVar4 = mpp_buffer_get_fd_with_caller(segmap_ptr,"hal_vp8d_vdpu1_gen_regs");
    *(int *)(lVar1 + 0x48) = iVar4;
  }
  else {
    *(undefined4 *)(lVar1 + 0x48) = *(undefined4 *)(lVar1 + 0x34);
  }
  if (p->ref_frame_sign_bias_golden != '\0') {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x12,(uint)p->ref_frame_sign_bias_golden);
  }
  if (((p->alt_fb_idx).field_0.bPicEntry & 0x7f) < 0x7f) {
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 8),(uint)((p->alt_fb_idx).field_0.bPicEntry & 0x7f),
               SLOT_BUFFER,&segmap_ptr);
    iVar4 = mpp_buffer_get_fd_with_caller(segmap_ptr,"hal_vp8d_vdpu1_gen_regs");
    *(int *)(lVar1 + 0x4c) = iVar4;
  }
  else {
    *(undefined4 *)(lVar1 + 0x4c) = *(undefined4 *)(lVar1 + 0x34);
  }
  if (p->ref_frame_sign_bias_altref != '\0') {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x13,(uint)p->ref_frame_sign_bias_altref);
  }
  if ((((p->stVP8Segments).field_0.wSegmentFlags & 1) != 0) ||
     (((p->stVP8Segments).field_0.wSegmentFlags >> 1 & 1) != 0)) {
    mpp_dev_set_reg_offset
              (*(MppDev *)((long)hal + 0x10),10,
               (uint)((p->stVP8Segments).field_0.wSegmentFlags & 1) +
               (uint)((p->stVP8Segments).field_0.wSegmentFlags >> 1 & 1) * 2);
  }
  *(uint *)(lVar1 + 0xc) =
       *(uint *)(lVar1 + 0xc) & 0xffefffff | (uint)((p->field_4).wFrameTagFlags & 1) << 0x14;
  *(uint *)(lVar1 + 0xc) =
       *(uint *)(lVar1 + 0xc) & 0xfbffffff | (uint)(p->mb_no_coeff_skip == '\0') << 0x1a;
  if (((p->stVP8Segments).field_0.wSegmentFlags & 1) == 0) {
    *(uint *)(lVar1 + 0x80) =
         *(uint *)(lVar1 + 0x80) & 0xff03ffff | (p->filter_level & 0x3f) << 0x12;
  }
  else if (((p->stVP8Segments).field_0.wSegmentFlags >> 2 & 1) == 0) {
    if ((int)((uint)p->filter_level + (int)(p->stVP8Segments).segment_feature_data[1][0]) < 0) {
      local_5c = 0;
    }
    else {
      if ((int)((uint)p->filter_level + (int)(p->stVP8Segments).segment_feature_data[1][0]) < 0x40)
      {
        local_60 = (uint)p->filter_level + (int)(p->stVP8Segments).segment_feature_data[1][0];
      }
      else {
        local_60 = 0x3f;
      }
      local_5c = local_60;
    }
    *(uint *)(lVar1 + 0x80) = *(uint *)(lVar1 + 0x80) & 0xff03ffff | (local_5c & 0x3f) << 0x12;
    if ((int)((uint)p->filter_level + (int)(p->stVP8Segments).segment_feature_data[1][1]) < 0) {
      local_64 = 0;
    }
    else {
      if ((int)((uint)p->filter_level + (int)(p->stVP8Segments).segment_feature_data[1][1]) < 0x40)
      {
        local_68 = (uint)p->filter_level + (int)(p->stVP8Segments).segment_feature_data[1][1];
      }
      else {
        local_68 = 0x3f;
      }
      local_64 = local_68;
    }
    *(uint *)(lVar1 + 0x80) = *(uint *)(lVar1 + 0x80) & 0xfffc0fff | (local_64 & 0x3f) << 0xc;
    if ((int)((uint)p->filter_level + (int)(p->stVP8Segments).segment_feature_data[1][2]) < 0) {
      local_6c = 0;
    }
    else {
      if ((int)((uint)p->filter_level + (int)(p->stVP8Segments).segment_feature_data[1][2]) < 0x40)
      {
        local_70 = (uint)p->filter_level + (int)(p->stVP8Segments).segment_feature_data[1][2];
      }
      else {
        local_70 = 0x3f;
      }
      local_6c = local_70;
    }
    *(uint *)(lVar1 + 0x80) = *(uint *)(lVar1 + 0x80) & 0xfffff03f | (local_6c & 0x3f) << 6;
    if ((int)((uint)p->filter_level + (int)(p->stVP8Segments).segment_feature_data[1][3]) < 0) {
      local_74 = 0;
    }
    else {
      if ((int)((uint)p->filter_level + (int)(p->stVP8Segments).segment_feature_data[1][3]) < 0x40)
      {
        local_78 = (uint)p->filter_level + (int)(p->stVP8Segments).segment_feature_data[1][3];
      }
      else {
        local_78 = 0x3f;
      }
      local_74 = local_78;
    }
    *(uint *)(lVar1 + 0x80) = *(uint *)(lVar1 + 0x80) & 0xffffffc0 | local_74 & 0x3f;
  }
  else {
    *(uint *)(lVar1 + 0x80) =
         *(uint *)(lVar1 + 0x80) & 0xff03ffff |
         ((int)(p->stVP8Segments).segment_feature_data[1][0] & 0x3fU) << 0x12;
    *(uint *)(lVar1 + 0x80) =
         *(uint *)(lVar1 + 0x80) & 0xfffc0fff |
         ((int)(p->stVP8Segments).segment_feature_data[1][1] & 0x3fU) << 0xc;
    *(uint *)(lVar1 + 0x80) =
         *(uint *)(lVar1 + 0x80) & 0xfffff03f |
         ((int)(p->stVP8Segments).segment_feature_data[1][2] & 0x3fU) << 6;
    *(uint *)(lVar1 + 0x80) =
         *(uint *)(lVar1 + 0x80) & 0xffffffc0 |
         (int)(p->stVP8Segments).segment_feature_data[1][3] & 0x3fU;
  }
  *(uint *)(lVar1 + 0x78) = *(uint *)(lVar1 + 0x78) & 0x7fffffff | (uint)p->filter_type << 0x1f;
  *(uint *)(lVar1 + 0x78) = *(uint *)(lVar1 + 0x78) & 0x8fffffff | (p->sharpness & 7) << 0x1c;
  if (p->filter_level == '\0') {
    *(uint *)(lVar1 + 0xc) = *(uint *)(lVar1 + 0xc) & 0xffffbfff | 0x4000;
  }
  if (((p->field_4).wFrameTagFlags >> 1 & 7) != 3) {
    *(uint *)(lVar1 + 0x1c) = *(uint *)(lVar1 + 0x1c) & 0xffffdfff | 0x2000;
  }
  if ((p->decMode == 2) && (((p->field_4).wFrameTagFlags >> 1 & 3) != 0)) {
    *(uint *)(lVar1 + 0x1c) = *(uint *)(lVar1 + 0x1c) & 0xffffefff | 0x1000;
  }
  *(uint *)(lVar1 + 0x14) = *(uint *)(lVar1 + 0x14) & 0xffff00ff | (p->bool_value & 0xff) << 8;
  *(uint *)(lVar1 + 0x14) = *(uint *)(lVar1 + 0x14) & 0xffffff00 | p->bool_range & 0xff;
  if (((p->stVP8Segments).field_0.wSegmentFlags & 1) == 0) {
    *(uint *)(lVar1 + 0x84) =
         *(uint *)(lVar1 + 0x84) & 0xffc007ff | ((int)p->y1ac_delta_q & 0x7ffU) << 0xb;
  }
  else if (((p->stVP8Segments).field_0.wSegmentFlags >> 2 & 1) == 0) {
    if ((int)p->y1ac_delta_q + (int)(p->stVP8Segments).segment_feature_data[0][0] < 0) {
      local_7c = 0;
    }
    else {
      if ((int)p->y1ac_delta_q + (int)(p->stVP8Segments).segment_feature_data[0][0] < 0x80) {
        local_80 = (int)p->y1ac_delta_q + (int)(p->stVP8Segments).segment_feature_data[0][0];
      }
      else {
        local_80 = 0x7f;
      }
      local_7c = local_80;
    }
    *(uint *)(lVar1 + 0x84) = *(uint *)(lVar1 + 0x84) & 0xffc007ff | (local_7c & 0x7ff) << 0xb;
    if ((int)p->y1ac_delta_q + (int)(p->stVP8Segments).segment_feature_data[0][1] < 0) {
      local_84 = 0;
    }
    else {
      if ((int)p->y1ac_delta_q + (int)(p->stVP8Segments).segment_feature_data[0][1] < 0x80) {
        local_88 = (int)p->y1ac_delta_q + (int)(p->stVP8Segments).segment_feature_data[0][1];
      }
      else {
        local_88 = 0x7f;
      }
      local_84 = local_88;
    }
    *(uint *)(lVar1 + 0x84) = *(uint *)(lVar1 + 0x84) & 0xfffff800 | local_84 & 0x7ff;
    if ((int)p->y1ac_delta_q + (int)(p->stVP8Segments).segment_feature_data[0][2] < 0) {
      local_8c = 0;
    }
    else {
      if ((int)p->y1ac_delta_q + (int)(p->stVP8Segments).segment_feature_data[0][2] < 0x80) {
        local_90 = (int)p->y1ac_delta_q + (int)(p->stVP8Segments).segment_feature_data[0][2];
      }
      else {
        local_90 = 0x7f;
      }
      local_8c = local_90;
    }
    *(uint *)(lVar1 + 0xb8) = *(uint *)(lVar1 + 0xb8) & 0xffc007ff | (local_8c & 0x7ff) << 0xb;
    if ((int)p->y1ac_delta_q + (int)(p->stVP8Segments).segment_feature_data[0][3] < 0) {
      local_94 = 0;
    }
    else {
      if ((int)p->y1ac_delta_q + (int)(p->stVP8Segments).segment_feature_data[0][3] < 0x80) {
        local_98 = (int)p->y1ac_delta_q + (int)(p->stVP8Segments).segment_feature_data[0][3];
      }
      else {
        local_98 = 0x7f;
      }
      local_94 = local_98;
    }
    *(uint *)(lVar1 + 0xb8) = *(uint *)(lVar1 + 0xb8) & 0xfffff800 | local_94 & 0x7ff;
  }
  else {
    *(uint *)(lVar1 + 0x84) =
         *(uint *)(lVar1 + 0x84) & 0xffc007ff |
         ((int)(p->stVP8Segments).segment_feature_data[0][0] & 0x7ffU) << 0xb;
    *(uint *)(lVar1 + 0x84) =
         *(uint *)(lVar1 + 0x84) & 0xfffff800 |
         (int)(p->stVP8Segments).segment_feature_data[0][1] & 0x7ffU;
    *(uint *)(lVar1 + 0xb8) =
         *(uint *)(lVar1 + 0xb8) & 0xffc007ff |
         ((int)(p->stVP8Segments).segment_feature_data[0][2] & 0x7ffU) << 0xb;
    *(uint *)(lVar1 + 0xb8) =
         *(uint *)(lVar1 + 0xb8) & 0xfffff800 |
         (int)(p->stVP8Segments).segment_feature_data[0][3] & 0x7ffU;
  }
  *(uint *)(lVar1 + 0x84) = *(uint *)(lVar1 + 0x84) & 0x7ffffff | (int)p->y1dc_delta_q << 0x1b;
  *(uint *)(lVar1 + 0x84) =
       *(uint *)(lVar1 + 0x84) & 0xf83fffff | ((int)p->y2dc_delta_q & 0x1fU) << 0x16;
  *(uint *)(lVar1 + 0xb8) = *(uint *)(lVar1 + 0xb8) & 0x7ffffff | (int)p->y2ac_delta_q << 0x1b;
  *(uint *)(lVar1 + 0xb8) =
       *(uint *)(lVar1 + 0xb8) & 0xf83fffff | ((int)p->uvdc_delta_q & 0x1fU) << 0x16;
  *(uint *)(lVar1 + 0xbc) = *(uint *)(lVar1 + 0xbc) & 0x7ffffff | (int)p->uvac_delta_q << 0x1b;
  if (p->mode_ref_lf_delta_enabled != '\0') {
    *(uint *)(lVar1 + 0x7c) =
         *(uint *)(lVar1 + 0x7c) & 0xf01fffff | ((int)p->ref_lf_deltas[0] & 0x7fU) << 0x15;
    *(uint *)(lVar1 + 0x7c) =
         *(uint *)(lVar1 + 0x7c) & 0xffe03fff | ((int)p->ref_lf_deltas[1] & 0x7fU) << 0xe;
    *(uint *)(lVar1 + 0x7c) =
         *(uint *)(lVar1 + 0x7c) & 0xffffc07f | ((int)p->ref_lf_deltas[2] & 0x7fU) << 7;
    *(uint *)(lVar1 + 0x7c) =
         *(uint *)(lVar1 + 0x7c) & 0xffffff80 | (int)p->ref_lf_deltas[3] & 0x7fU;
    *(uint *)(lVar1 + 0x78) =
         *(uint *)(lVar1 + 0x78) & 0xf01fffff | ((int)p->mode_lf_deltas[0] & 0x7fU) << 0x15;
    *(uint *)(lVar1 + 0x78) =
         *(uint *)(lVar1 + 0x78) & 0xffe03fff | ((int)p->mode_lf_deltas[1] & 0x7fU) << 0xe;
    *(uint *)(lVar1 + 0x78) =
         *(uint *)(lVar1 + 0x78) & 0xffffc07f | ((int)p->mode_lf_deltas[2] & 0x7fU) << 7;
    *(uint *)(lVar1 + 0x78) =
         *(uint *)(lVar1 + 0x78) & 0xffffff80 | (int)p->mode_lf_deltas[3] & 0x7fU;
  }
  if (((p->field_4).wFrameTagFlags >> 1 & 3) == 0) {
    hal_vp8d_pre_filter_tap_set((VP8DHalContext_t *)hal);
  }
  hal_vp8d_dct_partition_cfg((VP8DHalContext_t *)hal,_mb_width);
  mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x30),0,"hal_vp8d_vdpu1_gen_regs");
  mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x38),0,"hal_vp8d_vdpu1_gen_regs");
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"leave\n",0x26b,
               "hal_vp8d_vdpu1_gen_regs");
  }
  return mb_height;
}

Assistant:

MPP_RET hal_vp8d_vdpu1_gen_regs(void* hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    RK_U32 mb_width = 0, mb_height = 0;
    MppBuffer framebuf = NULL;
    RK_U8 *segmap_ptr = NULL;
    RK_U8 *probe_ptr = NULL;
    VP8DHalContext_t *ctx = (VP8DHalContext_t *)hal;
    VP8DRegSet_t *regs = (VP8DRegSet_t *)ctx->regs;
    DXVA_PicParams_VP8 *pic_param = (DXVA_PicParams_VP8 *)task->dec.syntax.data;

    FUN_T("enter\n");

    hal_vp8_init_hwcfg(ctx);
    mb_width = (pic_param->width + 15) >> 4;
    mb_height = (pic_param->height + 15) >> 4;

    regs->reg4.sw_pic_mb_width = mb_width & 0x1FF;
    regs->reg4.sw_pic_mb_hight_p =  mb_height & 0xFF;
    regs->reg4.sw_pic_mb_w_ext = mb_width >> 9;
    regs->reg4.sw_pic_mb_h_ext = mb_height >> 8;

    if (!pic_param->frame_type) {
        segmap_ptr = mpp_buffer_get_ptr(ctx->seg_map);
        if (NULL != segmap_ptr) {
            memset(segmap_ptr, 0, VP8D_MAX_SEGMAP_SIZE);
        }
    }

    probe_ptr = mpp_buffer_get_ptr(ctx->probe_table);
    if (NULL != probe_ptr) {
        hal_vp8hw_asic_probe_update(pic_param, probe_ptr);
    }
    mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->CurrPic.Index7Bits, SLOT_BUFFER, &framebuf);
    regs->reg13_cur_pic_base = mpp_buffer_get_fd(framebuf);
    if (!pic_param->frame_type) { //key frame
        if ((mb_width * mb_height) << 8 > 0x400000) {
            mpp_log("mb_width*mb_height is big then 0x400000,iommu err");
        }
        regs->reg14_ref0_base = regs->reg13_cur_pic_base;
        mpp_dev_set_reg_offset(ctx->dev, 14, (mb_width * mb_height) << 8);
    } else if (pic_param->lst_fb_idx.Index7Bits < 0x7f) { //config ref0 base
        mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->lst_fb_idx.Index7Bits, SLOT_BUFFER, &framebuf);
        regs->reg14_ref0_base = mpp_buffer_get_fd(framebuf);
    } else {
        regs->reg14_ref0_base = regs->reg13_cur_pic_base;
    }

    /* golden reference */
    if (pic_param->gld_fb_idx.Index7Bits < 0x7f) {
        mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->gld_fb_idx.Index7Bits, SLOT_BUFFER, &framebuf);
        regs->reg18_golden_ref_base = mpp_buffer_get_fd(framebuf);
    } else {
        regs->reg18_golden_ref_base = regs->reg13_cur_pic_base;
    }

    if (pic_param->ref_frame_sign_bias_golden) {
        mpp_dev_set_reg_offset(ctx->dev, 18, pic_param->ref_frame_sign_bias_golden);
    }

    /* alternate reference */
    if (pic_param->alt_fb_idx.Index7Bits < 0x7f) {
        mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->alt_fb_idx.Index7Bits, SLOT_BUFFER, &framebuf);
        regs->reg19.alternate_ref_base = mpp_buffer_get_fd(framebuf);
    } else {
        regs->reg19.alternate_ref_base = regs->reg13_cur_pic_base;
    }

    if (pic_param->ref_frame_sign_bias_altref) {
        mpp_dev_set_reg_offset(ctx->dev, 19, pic_param->ref_frame_sign_bias_altref);
    }

    if (pic_param->stVP8Segments.segmentation_enabled || pic_param->stVP8Segments.update_mb_segmentation_map) {
        mpp_dev_set_reg_offset(ctx->dev, 10, (pic_param->stVP8Segments.segmentation_enabled
                                              + (pic_param->stVP8Segments.update_mb_segmentation_map << 1)));
    }

    regs->reg3.sw_pic_inter_e = pic_param->frame_type;
    regs->reg3.sw_skip_mode = !pic_param->mb_no_coeff_skip;

    if (!pic_param->stVP8Segments.segmentation_enabled) {
        regs->reg32.sw_filt_level_0 = pic_param->filter_level;
    } else if (pic_param->stVP8Segments.update_mb_segmentation_data) {
        regs->reg32.sw_filt_level_0 =
            pic_param->stVP8Segments.segment_feature_data[1][0];
        regs->reg32.sw_filt_level_1 =
            pic_param->stVP8Segments.segment_feature_data[1][1];
        regs->reg32.sw_filt_level_2 =
            pic_param->stVP8Segments.segment_feature_data[1][2];
        regs->reg32.sw_filt_level_3 =
            pic_param->stVP8Segments.segment_feature_data[1][3];
    } else {
        regs->reg32.sw_filt_level_0 = CLIP3(0, 63,
                                            (RK_S32)pic_param->filter_level
                                            + pic_param->stVP8Segments.segment_feature_data[1][0]);
        regs->reg32.sw_filt_level_1 = CLIP3(0, 63,
                                            (RK_S32)pic_param->filter_level
                                            + pic_param->stVP8Segments.segment_feature_data[1][1]);
        regs->reg32.sw_filt_level_2 = CLIP3(0, 63,
                                            (RK_S32)pic_param->filter_level
                                            + pic_param->stVP8Segments.segment_feature_data[1][2]);
        regs->reg32.sw_filt_level_3 = CLIP3(0, 63,
                                            (RK_S32)pic_param->filter_level
                                            + pic_param->stVP8Segments.segment_feature_data[1][3]);
    }

    regs->reg30.sw_filt_type = pic_param->filter_type;
    regs->reg30.sw_filt_sharpness = pic_param->sharpness;

    if (pic_param->filter_level == 0)
        regs->reg3.sw_filtering_dis = 1;

    if (pic_param->version != 3)
        regs->reg7.sw_ch_mv_res = 1;

    if (pic_param->decMode == VP8HWD_VP8 && (pic_param->version & 0x3))
        regs->reg7.sw_bilin_mc_e = 1;

    regs->reg5.sw_boolean_value = pic_param->bool_value;
    regs->reg5.sw_boolean_range = pic_param->bool_range;

    {
        if (!pic_param->stVP8Segments.segmentation_enabled)
            regs->reg33.sw_quant_0 = pic_param->y1ac_delta_q;
        else if (pic_param->stVP8Segments.update_mb_segmentation_data) { /* absolute mode */
            regs->reg33.sw_quant_0 =
                pic_param->stVP8Segments.segment_feature_data[0][0];
            regs->reg33.sw_quant_1 =
                pic_param->stVP8Segments.segment_feature_data[0][1];
            regs->reg46.sw_quant_2 = pic_param->stVP8Segments.segment_feature_data[0][2];
            regs->reg46.sw_quant_3 = pic_param->stVP8Segments.segment_feature_data[0][3];
        } else { /* delta mode */
            regs->reg33.sw_quant_0 = CLIP3(0, 127,
                                           pic_param->y1ac_delta_q
                                           + pic_param->stVP8Segments.segment_feature_data[0][0]);
            regs->reg33.sw_quant_1 = CLIP3(0, 127,
                                           pic_param->y1ac_delta_q
                                           + pic_param->stVP8Segments.segment_feature_data[0][1]);
            regs->reg46.sw_quant_2 = CLIP3(0, 127,
                                           pic_param->y1ac_delta_q
                                           + pic_param->stVP8Segments.segment_feature_data[0][2]);
            regs->reg46.sw_quant_3 = CLIP3(0, 127,
                                           pic_param->y1ac_delta_q
                                           + pic_param->stVP8Segments.segment_feature_data[0][3]);
        }

        regs->reg33.sw_quant_delta_0 = pic_param->y1dc_delta_q;
        regs->reg33.sw_quant_delta_1 = pic_param->y2dc_delta_q;
        regs->reg46.sw_quant_delta_2 = pic_param->y2ac_delta_q;
        regs->reg46.sw_quant_delta_3 = pic_param->uvdc_delta_q;
        regs->reg47.sw_quant_delta_4 = pic_param->uvac_delta_q;

        if (pic_param->mode_ref_lf_delta_enabled) {
            regs->reg31.sw_filt_ref_adj_0 = pic_param->ref_lf_deltas[0];
            regs->reg31.sw_filt_ref_adj_1 = pic_param->ref_lf_deltas[1];
            regs->reg31.sw_filt_ref_adj_2 = pic_param->ref_lf_deltas[2];
            regs->reg31.sw_filt_ref_adj_3 = pic_param->ref_lf_deltas[3];
            regs->reg30.sw_filt_mb_adj_0  = pic_param->mode_lf_deltas[0];
            regs->reg30.sw_filt_mb_adj_1  = pic_param->mode_lf_deltas[1];
            regs->reg30.sw_filt_mb_adj_2  = pic_param->mode_lf_deltas[2];
            regs->reg30.sw_filt_mb_adj_3  = pic_param->mode_lf_deltas[3];
        }
    }

    if ((pic_param->version & 0x3) == 0)
        hal_vp8d_pre_filter_tap_set(ctx);

    hal_vp8d_dct_partition_cfg(ctx, task);

    mpp_buffer_sync_end(ctx->probe_table);
    mpp_buffer_sync_end(ctx->seg_map);

    FUN_T("leave\n");
    return ret;
}